

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall
ctemplate::VariableTemplateNode::DumpToString(VariableTemplateNode *this,int level,string *out)

{
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modvals;
  allocator local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (out != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"Variable Node: ",&local_79);
    (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)&(this->token_).modvals,modvals);
    std::operator+(&local_58,&local_78,"\n");
    AppendTokenWithIndent(level,out,&local_38,&this->token_,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x3f7,
                "virtual void ctemplate::VariableTemplateNode::DumpToString(int, string *) const");
}

Assistant:

virtual void DumpToString(int level, string *out) const {
    assert(out);
    AppendTokenWithIndent(level, out, "Variable Node: ", token_,
                          PrettyPrintTokenModifiers(token_.modvals) + "\n");
  }